

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFPageObjectHelper::getAttribute(QPDFPageObjectHelper *this,string *name,bool copy_if_shared)

{
  byte in_CL;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar1;
  function<QPDFObjectHandle_()> local_48;
  byte local_21;
  undefined8 uStack_20;
  bool copy_if_shared_local;
  string *name_local;
  QPDFPageObjectHelper *this_local;
  
  uStack_20 = CONCAT71(in_register_00000011,copy_if_shared);
  local_21 = in_CL & 1;
  name_local = name;
  this_local = this;
  std::function<QPDFObjectHandle_()>::function(&local_48,(nullptr_t)0x0);
  getAttribute(this,name,copy_if_shared,(function<QPDFObjectHandle_()> *)(ulong)(in_CL & 1),
               SUB81(&local_48,0));
  std::function<QPDFObjectHandle_()>::~function(&local_48);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFPageObjectHelper::getAttribute(std::string const& name, bool copy_if_shared)
{
    return getAttribute(name, copy_if_shared, nullptr, false);
}